

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.h
# Opt level: O3

void Firebird::ThrowStatusWrapper::checkException(ThrowStatusWrapper *status)

{
  IStatus *pIVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  
  if ((status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).dirty == true) {
    uVar2 = (**(code **)(*(long *)&(status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).
                                   super_IStatusImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
                                   .
                                   super_IStatusBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
                                   .
                                   super_IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
                                   .
                                   super_IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
                                   .
                                   super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
                                   .
                                   super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
                        + 0x20))();
    if ((uVar2 & 2) != 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      pIVar1 = (status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).status;
      *puVar3 = &PTR__FbException_00210ed8;
      uVar4 = (*(code *)(pIVar1->super_IDisposable).super_IVersioned.cloopVTable[5].version)();
      puVar3[1] = uVar4;
      __cxa_throw(puVar3,&FbException::typeinfo,FbException::~FbException);
    }
  }
  return;
}

Assistant:

static void checkException(ThrowStatusWrapper* status)
		{
			if (status->dirty && (status->getState() & IStatus::STATE_ERRORS))
				throw FbException(status->status);
		}